

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.c
# Opt level: O1

void ugui_graphics_draw_sprite(ugui_graphics_t *graphics,ugui_sprite_t sprite,ugui_point_t point)

{
  int iVar1;
  uint16_t y;
  uint uVar2;
  undefined1 local_50 [8];
  ugui_sprite_t sprite_local;
  ugui_pixel_t local_31 [8];
  ugui_pixel_t pixel;
  
  sprite_local._0_8_ = sprite.data;
  local_50._2_2_ = sprite.h;
  if (local_50._2_2_ != 0) {
    sprite_local.data = (uint8_t *)0x0;
    local_50 = (undefined1  [8])sprite._0_8_;
    do {
      if (local_50._0_2_ != 0) {
        iVar1 = (int)sprite_local.data;
        uVar2 = 0;
        y = (uint16_t)sprite_local.data;
        do {
          _ugui_sprite_get_pixel((ugui_sprite_t *)local_50,(uint16_t)uVar2,y,local_31);
          if (local_31[0] == true) {
            plot(graphics,((uint)point & 0xffff) + uVar2,iVar1 + ((uint)point >> 0x10));
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < (ushort)local_50._0_2_);
      }
      uVar2 = (int)sprite_local.data + 1;
      sprite_local.data = (uint8_t *)(ulong)uVar2;
    } while (uVar2 < (ushort)local_50._2_2_);
  }
  return;
}

Assistant:

void ugui_graphics_draw_sprite(ugui_graphics_t* graphics, ugui_sprite_t sprite, ugui_point_t point)
{
	for (int y = 0; y < sprite.h; y++) {
		for (int x = 0; x < sprite.w; x++) {
			ugui_pixel_t pixel;
			_ugui_sprite_get_pixel(&sprite, x, y, &pixel);
			if (pixel) {
				plot(graphics, point.x + x, point.y + y);
			}
		}
	}
}